

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O3

int validate_opcode(Dwarf_Debug dbg,Dwarf_Macro_Forms_s *curform,Dwarf_Error *error)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Dwarf_Signed errval;
  ulong uVar4;
  
  bVar1 = curform->mf_code;
  iVar3 = 0;
  if (bVar1 < 0xe0) {
    errval = 0x13f;
    if (0xf3 < (byte)(bVar1 - 0xd)) {
      bVar2 = curform->mf_formcount;
      errval = 0x140;
      if (bVar2 == dw5formsarray[bVar1].mf_formcount) {
        if ((ulong)bVar2 == 0) {
          return 0;
        }
        uVar4 = 0;
        while (curform->mf_formbytes[uVar4] == dw5formsarray[bVar1].mf_formbytes[1]) {
          uVar4 = uVar4 + 1;
          if (bVar2 == uVar4) {
            return 0;
          }
        }
      }
    }
    _dwarf_error(dbg,error,errval);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
validate_opcode(Dwarf_Debug dbg,
    struct Dwarf_Macro_Forms_s *curform,
    Dwarf_Error * error)
{
    unsigned i = 0;
    struct Dwarf_Macro_Forms_s *stdfptr = 0;
    if (curform->mf_code >= DW_MACRO_lo_user) {
        /* Nothing to check. user level. */
        return DW_DLV_OK;
    }
    if (curform->mf_code > DW_MACRO_undef_strx) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_BAD);
        return DW_DLV_ERROR;
    }
    if (!curform->mf_code){
        _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_BAD);
        return DW_DLV_ERROR;
    }
    stdfptr = &dwarf_default_macro_opslist.mol_data[curform->mf_code];

    if (curform->mf_formcount != stdfptr->mf_formcount) {
        _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_FORM_BAD);
        return DW_DLV_ERROR;
    }
    for (i = 0; i < curform->mf_formcount; ++i) {
        if (curform->mf_formbytes[i] != stdfptr->mf_formbytes[1]) {
            _dwarf_error(dbg, error, DW_DLE_MACRO_OPCODE_FORM_BAD);
            return DW_DLV_ERROR;
        }
    }
    return DW_DLV_OK;
}